

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this,ON_BrepFace *F)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  ON_BrepLoop *L_00;
  ON_BrepLoop *L;
  undefined1 local_38 [8];
  ON_SimpleArray<int> li;
  bool rc;
  int i;
  ON_BrepFace *F_local;
  ON_Brep *this_local;
  
  li.m_count._3_1_ = 0;
  ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_38,&F->m_li);
  for (li.m_capacity = 0; iVar1 = li.m_capacity,
      iVar4 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)local_38), bVar2 = li.m_count._3_1_,
      iVar1 < iVar4; li.m_capacity = li.m_capacity + 1) {
    piVar5 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_38,li.m_capacity);
    L_00 = ON_ClassArray<ON_BrepLoop>::operator[]((ON_ClassArray<ON_BrepLoop> *)&this->m_L,*piVar5);
    iVar1 = L_00->m_loop_index;
    piVar5 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_38,li.m_capacity);
    if ((iVar1 == *piVar5) && (bVar3 = RemoveSlits(this,L_00), bVar3)) {
      li.m_count._3_1_ = 1;
    }
  }
  ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_38);
  return (bool)(bVar2 & 1);
}

Assistant:

bool ON_Brep::RemoveSlits(ON_BrepFace& F)

{
  int i;
  bool rc = false;
  ON_SimpleArray<int> li = F.m_li;
  for (i=0; i<li.Count(); i++){
    ON_BrepLoop& L = m_L[li[i]];
    if (L.m_loop_index != li[i]) 
      continue;
    if (RemoveSlits(L))
      rc = true;
  }
  return rc;
}